

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void biflen(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  uint uVar2;
  runsdef *prVar3;
  int iVar4;
  runcxdef *prVar5;
  anon_union_8_4_1dda36f5_for_runsv aVar6;
  ushort *puVar7;
  runsdef val;
  runsdef local_30;
  
  prVar5 = ctx->bifcxrun;
  uVar1 = prVar5->runcxsp[-1].runstyp;
  prVar3 = prVar5->runcxsp + -1;
  if (uVar1 == '\a') {
    prVar5->runcxsp = prVar3;
    prVar5 = ctx->bifcxrun;
    if (prVar3->runstyp != '\a') {
      prVar5->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3fc);
    }
    puVar7 = (ushort *)(prVar5->runcxsp->runsv).runsvstr;
    iVar4 = *puVar7 - 2;
    if (iVar4 == 0) {
      aVar6.runsvnum = 0;
    }
    else {
      puVar7 = puVar7 + 1;
      aVar6.runsvnum = 0;
      do {
        uVar2 = datsiz((uint)(byte)*puVar7,(byte *)((long)puVar7 + 1));
        puVar7 = (ushort *)((long)puVar7 + (long)(int)(uVar2 + 1));
        aVar6.runsvstr = (uchar *)(aVar6.runsvnum + 1);
        iVar4 = iVar4 - (uVar2 + 1);
      } while (iVar4 != 0);
      prVar5 = ctx->bifcxrun;
    }
  }
  else {
    if (uVar1 != '\x03') {
      prVar5->runcxerr->errcxptr->erraav[0].errastr = "length";
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
      runsign(ctx->bifcxrun,0x3ff);
    }
    prVar5->runcxsp = prVar3;
    prVar5 = ctx->bifcxrun;
    if (prVar3->runstyp != '\x03') {
      prVar5->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3ef);
    }
    aVar6.runsvstr = (uchar *)((ulong)*(ushort *)(prVar5->runcxsp->runsv).runsvstr - 2);
  }
  local_30.runsv = aVar6;
  runpush(prVar5,1,&local_30);
  return;
}

Assistant:

void biflen(bifcxdef *ctx, int argc)
{
    uchar   *p;
    runsdef  val;
    long     len;
    int      l;
    
    bifcntargs(ctx, 1, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_SSTRING:
        p = (uchar *)runpopstr(ctx->bifcxrun);
        len = osrp2(p) - 2;
        break;

    case DAT_LIST:
        p = runpoplst(ctx->bifcxrun);
        l = osrp2(p) - 2;
        p += 2;
        
        /* count all elements in list */
        for (len = 0 ; l ; ++len)
        {
            int cursiz;
            
            /* get size of this element, and move past it */
            cursiz = datsiz(*p, p+1) + 1;
            l -= cursiz;
            p += cursiz;
        }
        break;

    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "length");
    }
    
    val.runsv.runsvnum = len;
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}